

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::requireInt16Arithmetic
          (TParseVersions *this,TSourceLoc *loc,char *op,char *featureDesc)

{
  TString combined;
  char *extensions [3];
  
  combined._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  combined._M_string_length = 0;
  combined.field_2._M_local_buf[0] = '\0';
  combined._M_dataplus._M_p = (pointer)&combined.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::assign
            (&combined,op);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&combined,": ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&combined,featureDesc);
  extensions[2] = "GL_EXT_shader_explicit_arithmetic_types_int16";
  extensions[0]._0_4_ = 0x5f60df;
  extensions[0]._4_4_ = 0;
  extensions[1]._0_4_ = 0x5f69c9;
  extensions[1]._4_4_ = 0;
  (*this->_vptr_TParseVersions[5])(this,loc,3,extensions,combined._M_dataplus._M_p);
  return;
}

Assistant:

void TParseVersions::requireInt16Arithmetic(const TSourceLoc& loc, const char* op, const char* featureDesc)
{
    TString combined;
    combined = op;
    combined += ": ";
    combined += featureDesc;

    const char* const extensions[] = {
                                       E_GL_AMD_gpu_shader_int16,
                                       E_GL_EXT_shader_explicit_arithmetic_types,
                                       E_GL_EXT_shader_explicit_arithmetic_types_int16};
    requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, combined.c_str());
}